

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack27_32(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  auVar2 = *(undefined1 (*) [32])(in + 1);
  auVar14 = vpmovsxbd_avx512f(_DAT_00194850);
  uVar3 = *in;
  auVar11 = *(undefined1 (*) [16])(in + 9);
  auVar15 = vpmovsxbd_avx512f(_DAT_00194860);
  uVar1 = *(ulong *)(in + 0xd);
  auVar12 = vpsllvd_avx2(auVar2,_DAT_001913c0);
  auVar9 = vpsllvd_avx2(auVar11,_DAT_00194750);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar1;
  auVar8 = vpsllvd_avx2(auVar23,_DAT_00194770);
  auVar12 = vpand_avx2(auVar12,_DAT_001913e0);
  auVar9 = vpand_avx(auVar9,_DAT_00194760);
  auVar10._8_4_ = 0x7fff800;
  auVar10._0_8_ = 0x7ff000007fff800;
  auVar10._12_4_ = 0x7ff0000;
  auVar8 = vpandq_avx512vl(auVar8,auVar10);
  *out = uVar3 & 0x7ffffff;
  auVar14 = vpermi2d_avx512f(auVar14,ZEXT3264(auVar2),ZEXT464(uVar3));
  auVar16 = vpmovsxbd_avx512f(_DAT_00194870);
  auVar14 = vpermi2d_avx512f(auVar15,auVar14,ZEXT1664(auVar11));
  auVar14 = vpermi2d_avx512f(auVar16,auVar14,ZEXT864(uVar1));
  auVar15 = vpsrlvd_avx512f(auVar14,_DAT_001a6380);
  auVar14 = vpmovsxbd_avx512f(_DAT_00194880);
  auVar14 = vpermi2d_avx512f(auVar14,ZEXT3264(auVar12),ZEXT1664(auVar9));
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar11 = vpmovsxbq_avx(ZEXT216(0x105));
  auVar14 = vpermi2q_avx512f(auVar16,auVar14,ZEXT1664(auVar8));
  auVar16 = vpord_avx512f(auVar15,auVar14);
  auVar14._8_4_ = 0x7ffffff;
  auVar14._0_8_ = 0x7ffffff07ffffff;
  auVar14._12_4_ = 0x7ffffff;
  auVar14._16_4_ = 0x7ffffff;
  auVar14._20_4_ = 0x7ffffff;
  auVar14._24_4_ = 0x7ffffff;
  auVar14._28_4_ = 0x7ffffff;
  auVar14._32_4_ = 0x7ffffff;
  auVar14._36_4_ = 0x7ffffff;
  auVar14._40_4_ = 0x7ffffff;
  auVar14._44_4_ = 0x7ffffff;
  auVar14._48_4_ = 0x7ffffff;
  auVar14._52_4_ = 0x7ffffff;
  auVar14._56_4_ = 0x7ffffff;
  auVar14._60_4_ = 0x7ffffff;
  auVar14 = vpandd_avx512f(auVar15,auVar14);
  auVar15._0_20_ = auVar16._0_20_;
  auVar15._20_4_ = auVar14._20_4_;
  auVar15._24_4_ = auVar16._24_4_;
  auVar15._28_4_ = auVar16._28_4_;
  auVar15._32_4_ = auVar16._32_4_;
  auVar15._36_4_ = auVar16._36_4_;
  auVar15._40_4_ = auVar16._40_4_;
  auVar15._44_4_ = auVar14._44_4_;
  auVar15._48_4_ = auVar16._48_4_;
  auVar15._52_4_ = auVar16._52_4_;
  auVar15._56_4_ = auVar16._56_4_;
  auVar15._60_4_ = auVar16._60_4_;
  uVar1 = *(ulong *)(in + 0x14);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar1;
  auVar9 = vpsllvd_avx2(auVar21,_DAT_00194790);
  auVar8._8_4_ = 0x7f80000;
  auVar8._0_8_ = 0x700000007f80000;
  auVar8._12_4_ = 0x7000000;
  auVar9 = vpandq_avx512vl(auVar9,auVar8);
  auVar8 = vpermi2d_avx512vl(auVar11,*(undefined1 (*) [16])(in + 0xf),auVar23);
  auVar24._8_8_ = *(undefined8 *)(in + 0x11);
  auVar24._0_8_ = *(undefined8 *)(in + 0x11);
  auVar11 = vpshufd_avx(*(undefined1 (*) [16])(in + 0xf),0xb4);
  auVar11 = vpsllvd_avx2(auVar11,_DAT_001947c0);
  auVar14 = vmovdqu64_avx512f(auVar15);
  *(undefined1 (*) [64])(out + 1) = auVar14;
  auVar12 = vpbroadcastd_avx512vl();
  auVar11 = vpand_avx(auVar11,_DAT_001947d0);
  auVar22._0_8_ = auVar9._0_8_;
  auVar22._8_8_ = auVar22._0_8_;
  auVar22._16_8_ = auVar22._0_8_;
  auVar22._24_8_ = auVar22._0_8_;
  auVar13._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar8;
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
  auVar2 = vpmovsxbd_avx2(ZEXT816(0xe050402020100));
  auVar13 = vpermi2d_avx512vl(auVar2,auVar13,auVar12);
  uVar20 = (undefined4)uVar1;
  auVar19._4_4_ = uVar20;
  auVar19._0_4_ = uVar20;
  auVar19._8_4_ = uVar20;
  auVar19._12_4_ = uVar20;
  auVar19._16_4_ = uVar20;
  auVar19._20_4_ = uVar20;
  auVar19._24_4_ = uVar20;
  auVar19._28_4_ = uVar20;
  auVar2 = vpermq_avx2(ZEXT1632(auVar11),0xd4);
  auVar11 = vpinsrd_avx(auVar11,0x7ffffff,2);
  auVar9 = vpshufd_avx(auVar21,0x55);
  auVar2 = vpblendd_avx2(auVar2,ZEXT1632(auVar11),0xf);
  auVar12 = vpbroadcastd_avx512vl();
  uVar4 = in[0x16];
  auVar12 = vpblendd_avx2(auVar2,auVar12,0x20);
  auVar12 = vpblendd_avx2(auVar12,auVar22,0xc0);
  auVar13 = vpblendd_avx2(auVar13,auVar19,0x80);
  auVar13 = vpsrlvd_avx2(auVar13,_DAT_00191420);
  auVar11 = vpinsrd_avx(auVar9,uVar4,2);
  auVar12 = vpor_avx2(auVar13,auVar12);
  auVar2 = vpand_avx2(auVar13,auVar2);
  auVar2 = vpblendd_avx2(auVar12,auVar2,4);
  auVar9 = vpmovsxbd_avx(ZEXT416(0x4020000));
  *(undefined1 (*) [32])(out + 0x11) = auVar2;
  uVar1 = *(ulong *)(in + 0x17);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar8 = vpsllvd_avx2(auVar17,_DAT_001947e0);
  auVar6._8_4_ = 0x7ffff80;
  auVar6._0_8_ = 0x7fff00007ffff80;
  auVar6._12_4_ = 0x7fff000;
  auVar10 = vpandq_avx512vl(auVar8,auVar6);
  auVar11 = vpermi2d_avx512vl(auVar9,auVar11,auVar17);
  auVar8 = vpsrlvd_avx2(auVar11,_DAT_00194810);
  uVar5 = *(ulong *)(in + 0x19);
  auVar11 = vpinsrd_avx(ZEXT416(0x7ffffff),uVar4 * 4 & 0x7fffffc,1);
  auVar9 = vpunpcklqdq_avx(auVar11,auVar10);
  auVar11 = vpand_avx(auVar8,ZEXT416(0x7ffffff));
  auVar8 = vpor_avx(auVar8,auVar9);
  auVar9 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar11 = vpblendd_avx2(auVar8,auVar11,1);
  *(undefined1 (*) [16])(out + 0x19) = auVar11;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar5;
  auVar11 = vpermi2d_avx512vl(auVar9,auVar11,auVar18);
  auVar9 = vpsrlvd_avx2(auVar11,_DAT_00194820);
  auVar11 = vpsllvd_avx2(auVar18,_DAT_00194830);
  auVar7._8_4_ = 0x7fe0000;
  auVar7._0_8_ = 0x7c0000007fe0000;
  auVar7._12_4_ = 0x7c00000;
  auVar11 = vpternlogq_avx512vl(auVar11,auVar9,auVar7,0xec);
  *(long *)(out + 0x1d) = auVar11._0_8_;
  out[0x1f] = (uint)(uVar5 >> 0x25);
  return in + 0x1b;
}

Assistant:

const uint32_t *__fastunpack27_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 19)) << (27 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 14)) << (27 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 9)) << (27 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 4)) << (27 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 27);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 26)) << (27 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 21)) << (27 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 16)) << (27 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 11)) << (27 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 6)) << (27 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 1)) << (27 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 27);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 23)) << (27 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 18)) << (27 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 13)) << (27 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 8)) << (27 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 3)) << (27 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 27);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 25)) << (27 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 20)) << (27 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 15)) << (27 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 10)) << (27 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 5)) << (27 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  out++;

  return in;
}